

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextdocument.cpp
# Opt level: O3

void QTextDocument::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFont *font;
  byte *pbVar1;
  code *pcVar2;
  long lVar3;
  PrivateShared *pPVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QArrayData *pQVar8;
  byte bVar9;
  undefined1 uVar10;
  QAbstractTextDocumentLayout *pQVar11;
  int iVar12;
  bool undo;
  QTextDocumentPrivate *pQVar13;
  long in_FS_OFFSET;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 in_XMM1_Qa;
  undefined4 local_3c;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    if (0xd < (uint)_id) goto switchD_004cb5ec_caseD_3;
    pbVar1 = (byte *)*_a;
    switch(_id) {
    case 0:
      bVar9 = *(byte *)(*(long *)(_o + 8) + 0xb8);
      goto LAB_004cb980;
    case 1:
      bVar9 = *(byte *)(*(long *)(_o + 8) + 200);
      goto LAB_004cb980;
    case 2:
      uVar6 = *(undefined8 *)(*(long *)(_o + 8) + 0x2a0);
      *(undefined8 *)pbVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x298);
      *(undefined8 *)(pbVar1 + 8) = uVar6;
      break;
    case 3:
      QFont::QFont((QFont *)&local_38,(QFont *)(*(long *)(_o + 8) + 0x128));
      pPVar4 = *(PrivateShared **)pbVar1;
      *(PrivateShared **)pbVar1 = local_38.shared;
      uVar14 = *(undefined4 *)(pbVar1 + 8);
      *(undefined4 *)(pbVar1 + 8) = local_38._8_4_;
      local_38._8_4_ = uVar14;
      local_38.shared = pPVar4;
      QFont::~QFont((QFont *)&local_38);
      break;
    case 4:
      *pbVar1 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x1d0) >> 0xd) & 1;
      break;
    case 5:
      bVar9 = *(byte *)(*(long *)(_o + 8) + 0x1cd);
LAB_004cb980:
      *pbVar1 = bVar9;
      break;
    case 6:
      pQVar11 = documentLayout((QTextDocument *)_o);
      uVar6 = (**(code **)(*(long *)pQVar11 + 0x78))(pQVar11);
      *(undefined8 *)pbVar1 = uVar6;
      *(undefined8 *)(pbVar1 + 8) = in_XMM1_Qa;
      break;
    case 7:
      uVar14 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x298);
      uVar15 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x298) >> 0x20);
      goto LAB_004cb960;
    case 8:
      uVar14 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x160) + 0xc);
      goto LAB_004cba51;
    case 9:
      uVar14 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x308);
      uVar15 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x308) >> 0x20);
      goto LAB_004cb960;
    case 10:
      lVar3 = *(long *)(_o + 8);
      piVar5 = *(int **)(lVar3 + 0x1b0);
      uVar6 = *(undefined8 *)(lVar3 + 0x1b8);
      uVar7 = *(undefined8 *)(lVar3 + 0x1c0);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      pQVar8 = *(QArrayData **)pbVar1;
      *(int **)pbVar1 = piVar5;
      *(undefined8 *)(pbVar1 + 8) = uVar6;
      *(undefined8 *)(pbVar1 + 0x10) = uVar7;
      if (pQVar8 != (QArrayData *)0x0) {
        LOCK();
        (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            QArrayData::deallocate(pQVar8,2,0x10);
            return;
          }
          goto LAB_004cbdba;
        }
      }
      break;
    case 0xb:
      uVar14 = *(undefined4 *)(*(long *)(_o + 8) + 0x290);
LAB_004cba51:
      *(undefined4 *)pbVar1 = uVar14;
      break;
    case 0xc:
      uVar14 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x310);
      uVar15 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x310) >> 0x20);
LAB_004cb960:
      *(ulong *)pbVar1 = CONCAT44(uVar15,uVar14);
      break;
    case 0xd:
      QUrl::QUrl((QUrl *)&local_38.shared,(QUrl *)(*(long *)(_o + 8) + 0x318));
      pPVar4 = *(PrivateShared **)pbVar1;
      *(PrivateShared **)pbVar1 = local_38.shared;
      local_38.shared = pPVar4;
      QUrl::~QUrl((QUrl *)&local_38.shared);
    }
    goto switchD_004cb5ec_caseD_3;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      font = (QFont *)*_a;
      switch(_id) {
      case 0:
        uVar10 = *(undefined1 *)&(font->d).d.ptr;
        pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_004cb892:
          QTextDocumentPrivate::enableUndoRedo(pQVar13,(bool)uVar10);
          return;
        }
        break;
      case 1:
        uVar10 = *(undefined1 *)&(font->d).d.ptr;
        goto LAB_004cbc78;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setPageSize((QTextDocument *)_o,(QSizeF *)font);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDefaultFont((QTextDocument *)_o,font);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setUseDesignMetrics((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setLayoutEnabled((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
          return;
        }
        break;
      default:
        goto switchD_004cb5ec_caseD_3;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTextWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setIndentWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDefaultStyleSheet((QTextDocument *)_o,(QString *)font);
          return;
        }
        break;
      case 0xb:
        pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
        pQVar13->maximumBlockCount = *(int *)&(font->d).d.ptr;
        QTextDocumentPrivate::ensureMaximumBlockCount(pQVar13);
        pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          uVar10 = false;
          goto LAB_004cb892;
        }
        break;
      case 0xc:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDocumentMargin((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 0xd:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setBaseUrl((QTextDocument *)_o,(QUrl *)font);
          return;
        }
      }
      goto LAB_004cbdba;
    }
  default:
    goto switchD_004cb5ec_caseD_3;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == contentsChange && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == contentsChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == undoAvailable && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == redoAvailable && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == undoCommandAdded && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == modificationChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == cursorPositionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar2 == blockCountChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar2 == baseUrlChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar2 == documentLayoutChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 9;
    }
    goto switchD_004cb5ec_caseD_3;
  }
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      contentsChange((QTextDocument *)_o,*_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar12 = 1;
LAB_004cbc33:
      QMetaObject::activate(_o,&staticMetaObject,iVar12,(void **)0x0);
      return;
    }
    break;
  case 2:
    local_38._8_8_ = &local_3c;
    local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
    iVar12 = 2;
    goto LAB_004cbd10;
  case 3:
    local_38._8_8_ = &local_3c;
    local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
    iVar12 = 3;
    goto LAB_004cbd10;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar12 = 4;
      goto LAB_004cbc33;
    }
    break;
  case 5:
    local_38._8_8_ = &local_3c;
    local_3c = CONCAT31(local_3c._1_3_,*_a[1]);
    iVar12 = 5;
    goto LAB_004cbd10;
  case 6:
    local_38._8_8_ = _a[1];
    iVar12 = 6;
    goto LAB_004cbd10;
  case 7:
    local_3c = *_a[1];
    local_38._8_8_ = &local_3c;
    iVar12 = 7;
    goto LAB_004cbd10;
  case 8:
    local_38._8_8_ = _a[1];
    iVar12 = 8;
LAB_004cbd10:
    local_38.shared = (PrivateShared *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar12,&local_38.shared);
switchD_004cb5ec_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar12 = 9;
      goto LAB_004cbc33;
    }
    break;
  case 10:
    pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      undo = true;
LAB_004cbce1:
      QTextDocumentPrivate::undoRedo(pQVar13,undo);
      return;
    }
    break;
  case 0xb:
    pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      undo = false;
      goto LAB_004cbce1;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QTextDocumentPrivate::appendUndoItem(*(QTextDocumentPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0xd:
    uVar10 = *_a[1];
LAB_004cbc78:
    pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_004cbc93:
      QTextDocumentPrivate::setModified(pQVar13,(bool)uVar10);
      return;
    }
    break;
  case 0xe:
    pQVar13 = *(QTextDocumentPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
    uVar10 = true;
    goto LAB_004cbc93;
  case 0xf:
    local_38._16_4_ = 0xaaaaaaaa;
    local_38._20_4_ = 0xaaaaaaaa;
    uStack_20 = 0xaaaaaaaa;
    uStack_1c = 0xaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x70))(&local_38,_o,*_a[1],_a[2]);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_38);
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
  default:
    goto switchD_004cb5ec_caseD_3;
  }
LAB_004cbdba:
  __stack_chk_fail();
}

Assistant:

void QTextDocument::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextDocument *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->contentsChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 1: _t->contentsChanged(); break;
        case 2: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->undoCommandAdded(); break;
        case 5: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<QTextCursor>>(_a[1]))); break;
        case 7: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->baseUrlChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->documentLayoutChanged(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->appendUndoItem((*reinterpret_cast< std::add_pointer_t<QAbstractUndoItem*>>(_a[1]))); break;
        case 13: _t->setModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->setModified(); break;
        case 15: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int , int , int )>(_a, &QTextDocument::contentsChange, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::contentsChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::undoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::redoAvailable, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::undoCommandAdded, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::modificationChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QTextCursor & )>(_a, &QTextDocument::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int )>(_a, &QTextDocument::blockCountChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QUrl & )>(_a, &QTextDocument::baseUrlChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::documentLayoutChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 2: *reinterpret_cast<QSizeF*>(_v) = _t->pageSize(); break;
        case 3: *reinterpret_cast<QFont*>(_v) = _t->defaultFont(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->useDesignMetrics(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isLayoutEnabled(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->textWidth(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->blockCount(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->indentWidth(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->defaultStyleSheet(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->maximumBlockCount(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->documentMargin(); break;
        case 13: *reinterpret_cast<QUrl*>(_v) = _t->baseUrl(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setPageSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 3: _t->setDefaultFont(*reinterpret_cast<QFont*>(_v)); break;
        case 4: _t->setUseDesignMetrics(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setLayoutEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTextWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setIndentWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setDefaultStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setMaximumBlockCount(*reinterpret_cast<int*>(_v)); break;
        case 12: _t->setDocumentMargin(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->setBaseUrl(*reinterpret_cast<QUrl*>(_v)); break;
        default: break;
        }
    }
}